

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_number(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx,lyxp_set *set)

{
  ushort uVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  longdouble in_ST0;
  char *local_38;
  char *endptr;
  
  if (set == (lyxp_set *)0x0) {
    pcVar4 = "skipped";
LAB_001759ca:
    pcVar3 = print_token(exp->tokens[*exp_idx]);
    iVar5 = 0;
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_number",pcVar4,pcVar3,(ulong)exp->expr_pos[*exp_idx]);
    *exp_idx = *exp_idx + 1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    strtold(exp->expr + exp->expr_pos[*exp_idx],&local_38);
    if (*piVar2 == 0) {
      if ((long)local_38 -
          (long)(exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)((uint)*exp_idx * 2))) ==
          (ulong)*(ushort *)((long)exp->tok_len + (ulong)((uint)*exp_idx * 2))) {
        set_fill_number(set,in_ST0);
        pcVar4 = "parsed";
        goto LAB_001759ca;
      }
      ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown");
      uVar1 = *(ushort *)((long)exp->tok_len + (ulong)((uint)*exp_idx * 2));
      pcVar4 = exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)((uint)*exp_idx * 2));
      pcVar3 = "Failed to convert \"%.*s\" into a long double.";
    }
    else {
      ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
              exp->expr + exp->expr_pos[*exp_idx]);
      uVar1 = *(ushort *)((long)exp->tok_len + (ulong)((uint)*exp_idx * 2));
      pcVar4 = exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)((uint)*exp_idx * 2));
      strerror(*piVar2);
      pcVar3 = "Failed to convert \"%.*s\" into a long double (%s).";
    }
    iVar5 = -1;
    ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar3,(ulong)uVar1,pcVar4);
  }
  return iVar5;
}

Assistant:

static int
eval_number(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx, struct lyxp_set *set)
{
    long double num;
    char *endptr;

    if (set) {
        errno = 0;
        num = strtold(&exp->expr[exp->expr_pos[*exp_idx]], &endptr);
        if (errno) {
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double (%s).",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]], strerror(errno));
            return -1;
        } else if (endptr - &exp->expr[exp->expr_pos[*exp_idx]] != exp->tok_len[*exp_idx]) {
            LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double.",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }

        set_fill_number(set, num);
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);
    return EXIT_SUCCESS;
}